

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRShared.cpp
# Opt level: O0

void __thiscall Assimp::IrrlichtBase::ReadVectorProperty(IrrlichtBase *this,VectorProperty *out)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar3;
  char *local_60;
  char *ptr;
  allocator<char> local_41;
  string local_40 [36];
  uint local_1c;
  VectorProperty *pVStack_18;
  int i;
  VectorProperty *out_local;
  IrrlichtBase *this_local;
  
  pVStack_18 = out;
  out_local = (VectorProperty *)this;
  for (local_1c = 0; uVar1 = local_1c, iVar2 = (*this->reader->_vptr_IIrrXMLReader[4])(),
      (int)uVar1 < iVar2; local_1c = local_1c + 1) {
    iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)local_1c);
    iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var,iVar2),"name");
    if (iVar2 == 0) {
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)local_1c);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_40,(char *)CONCAT44(extraout_var_00,iVar2),&local_41);
      std::__cxx11::string::operator=((string *)pVStack_18,local_40);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
    }
    else {
      iVar2 = (*this->reader->_vptr_IIrrXMLReader[5])(this->reader,(ulong)local_1c);
      iVar2 = ASSIMP_stricmp((char *)CONCAT44(extraout_var_01,iVar2),"value");
      if (iVar2 == 0) {
        iVar2 = (*this->reader->_vptr_IIrrXMLReader[6])(this->reader,(ulong)local_1c);
        local_60 = (char *)CONCAT44(extraout_var_02,iVar2);
        SkipSpaces<char>(&local_60);
        local_60 = fast_atoreal_move<float>(local_60,&(pVStack_18->value).x,true);
        SkipSpaces<char>(&local_60);
        if (*local_60 == ',') {
          SkipSpaces<char>(local_60 + 1,&local_60);
        }
        else {
          pLVar3 = DefaultLogger::get();
          Logger::error(pLVar3,"IRR(MESH): Expected comma in vector definition");
        }
        local_60 = fast_atoreal_move<float>(local_60,&(pVStack_18->value).y,true);
        SkipSpaces<char>(&local_60);
        if (*local_60 == ',') {
          SkipSpaces<char>(local_60 + 1,&local_60);
        }
        else {
          pLVar3 = DefaultLogger::get();
          Logger::error(pLVar3,"IRR(MESH): Expected comma in vector definition");
        }
        local_60 = fast_atoreal_move<float>(local_60,&(pVStack_18->value).z,true);
      }
    }
  }
  return;
}

Assistant:

void IrrlichtBase::ReadVectorProperty  (VectorProperty&  out)
{
    for (int i = 0; i < reader->getAttributeCount();++i)
    {
        if (!ASSIMP_stricmp(reader->getAttributeName(i),"name"))
        {
            out.name = std::string( reader->getAttributeValue(i) );
        }
        else if (!ASSIMP_stricmp(reader->getAttributeName(i),"value"))
        {
            // three floats, separated with commas
            const char* ptr = reader->getAttributeValue(i);

            SkipSpaces(&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.x );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.y );
            SkipSpaces(&ptr);
            if (',' != *ptr)
            {
                ASSIMP_LOG_ERROR("IRR(MESH): Expected comma in vector definition");
            }
            else SkipSpaces(ptr+1,&ptr);
            ptr = fast_atoreal_move<float>( ptr,(float&)out.value.z );
        }
    }
}